

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O0

void archive_entry_set_ino64(archive_entry *entry,la_int64_t ino)

{
  la_int64_t ino_local;
  archive_entry *entry_local;
  
  if (ino < 0) {
    entry->stat_valid = L'\0';
    entry->ae_set = entry->ae_set & 0xffffff7f;
  }
  else {
    entry->stat_valid = L'\0';
    entry->ae_set = entry->ae_set | 0x80;
    (entry->ae_stat).aest_ino = ino;
  }
  return;
}

Assistant:

void
archive_entry_set_ino64(struct archive_entry *entry, la_int64_t ino)
{
	if (ino < 0) {
		entry->stat_valid = 0;
		entry->ae_set &= ~AE_SET_INO;
		return;
	}
	entry->stat_valid = 0;
	entry->ae_set |= AE_SET_INO;
	entry->ae_stat.aest_ino = ino;
}